

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Minisat::Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::build
          (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this,
          vec<int,_int> *ns)

{
  int k;
  int *piVar1;
  uint i_00;
  ulong uVar2;
  int i;
  long lVar3;
  long lVar4;
  
  for (lVar3 = 0; piVar1 = (this->heap).data, lVar3 < (this->heap).sz; lVar3 = lVar3 + 1) {
    piVar1 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&this->indices,piVar1[lVar3]);
    *piVar1 = -1;
  }
  if (piVar1 != (int *)0x0) {
    (this->heap).sz = 0;
  }
  lVar3 = 0;
  lVar4 = 0;
  while( true ) {
    if (ns->sz <= lVar4) {
      uVar2 = (long)(this->heap).sz / 2 & 0xffffffff;
      while (0 < (int)uVar2) {
        i_00 = (int)uVar2 - 1;
        percolateDown(this,i_00);
        uVar2 = (ulong)i_00;
      }
      return;
    }
    k = *(int *)((long)ns->data + lVar3);
    if ((this->indices).map.sz <= k) break;
    piVar1 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,k);
    *piVar1 = (int)lVar4;
    vec<int,_int>::push(&this->heap,(int *)((long)ns->data + lVar3));
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 4;
  }
  __assert_fail("indices.has(ns[i])",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Heap.h"
                ,0x93,
                "void Minisat::Heap<int, Minisat::Solver::VarOrderLt>::build(const vec<K> &) [K = int, Comp = Minisat::Solver::VarOrderLt, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void build(const vec<K>& ns) {
        for (int i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear();

        for (int i = 0; i < ns.size(); i++){
            // TODO: this should probably call reserve instead of relying on it being reserved already.
            assert(indices.has(ns[i]));
            indices[ns[i]] = i;
            heap.push(ns[i]); }

        for (int i = heap.size() / 2 - 1; i >= 0; i--)
            percolateDown(i);
    }